

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxReporters.cpp
# Opt level: O0

void __thiscall ApprovalTests::Linux::LinuxDiffReporter::LinuxDiffReporter(LinuxDiffReporter *this)

{
  initializer_list<ApprovalTests::Reporter_*> __l;
  FirstWorkingReporter *pFVar1;
  allocator_type *__a;
  pointer ppRVar2;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *in_RDI;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *this_00;
  size_type in_stack_ffffffffffffffa0;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
  *in_stack_ffffffffffffffa8;
  FirstWorkingReporter *this_01;
  KDiff3Reporter *in_stack_ffffffffffffffc0;
  SublimeMergeReporter *in_stack_fffffffffffffff0;
  
  pFVar1 = (FirstWorkingReporter *)operator_new(0x70);
  BeyondCompareReporter::BeyondCompareReporter((BeyondCompareReporter *)in_stack_ffffffffffffffc0);
  this_01 = pFVar1;
  __a = (allocator_type *)operator_new(0x70);
  MeldReporter::MeldReporter((MeldReporter *)in_stack_ffffffffffffffc0);
  this_00 = (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
            &stack0xffffffffffffffc0;
  ppRVar2 = (pointer)operator_new(0x20);
  SublimeMergeReporter::SublimeMergeReporter(in_stack_fffffffffffffff0);
  (this_00->
  super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>)._M_impl
  .super__Vector_impl_data._M_start = ppRVar2;
  operator_new(0x70);
  KDiff3Reporter::KDiff3Reporter(in_stack_ffffffffffffffc0);
  ::std::allocator<ApprovalTests::Reporter_*>::allocator
            ((allocator<ApprovalTests::Reporter_*> *)0x1e2cef);
  __l._M_len = in_stack_ffffffffffffffa0;
  __l._M_array = (iterator)pFVar1;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            (in_RDI,__l,__a);
  FirstWorkingReporter::FirstWorkingReporter(this_01,in_stack_ffffffffffffffa8);
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::~vector
            (this_00);
  ::std::allocator<ApprovalTests::Reporter_*>::~allocator
            ((allocator<ApprovalTests::Reporter_*> *)0x1e2d3a);
  (in_RDI->super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__LinuxDiffReporter_0027bb78;
  return;
}

Assistant:

LinuxDiffReporter::LinuxDiffReporter()
            : FirstWorkingReporter({
                  // begin-snippet: linux_diff_reporters
                  new BeyondCompareReporter(),
                  new MeldReporter(),
                  new SublimeMergeReporter(),
                  new KDiff3Reporter()
                  // end-snippet
              })
        {
        }